

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::calculate_Qn_vector_positive_charge
          (singleParticleSpectra *this,int event_id,
          vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_real_err,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<double,_std::allocator<double>_> *event_Qn_imag_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag_err)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  double dVar5;
  double dVar6;
  particleSamples *ppVar7;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000008;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000010;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000018;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000020;
  double sin_nphi;
  double cos_nphi;
  int iorder;
  int p_idx;
  double p_phi;
  double p_perp;
  double py_local;
  double px_local;
  double pmag;
  double mass;
  double rap_local;
  double E_local;
  double pz_local;
  int i_1;
  int number_of_particles;
  int j;
  int i;
  int in_stack_fffffffffffffc9c;
  particleSamples *in_stack_fffffffffffffca0;
  particleSamples *ppVar8;
  double in_stack_fffffffffffffca8;
  particleSamples *in_stack_fffffffffffffcb0;
  int local_2e8;
  double local_2b0;
  double local_238;
  double local_1c0;
  double local_148;
  double local_110;
  double local_98;
  int local_40;
  int local_38;
  int local_34;
  
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x1c8); local_34 = local_34 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_34);
    *pvVar3 = 0.0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)local_34);
    *pvVar3 = 0.0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)local_34);
    *pvVar3 = 0.0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R9,(long)local_34);
    *pvVar3 = 0.0;
    for (local_38 = 0; local_38 < *(int *)(in_RDI + 0x1d0); local_38 = local_38 + 1) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000008,(long)local_34);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_38);
      *pvVar3 = 0.0;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000010,(long)local_34);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_38);
      *pvVar3 = 0.0;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000018,(long)local_34);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_38);
      *pvVar3 = 0.0;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000020,(long)local_34);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_38);
      *pvVar3 = 0.0;
    }
  }
  std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169bb5);
  iVar1 = particleSamples::get_number_of_positive_particles
                    (in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
  for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x169bf8);
    particleSamples::get_positive_particle
              (in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
               SUB84(in_stack_fffffffffffffca8,0));
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x169c36);
    particleSamples::get_positive_particle
              (in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
               SUB84(in_stack_fffffffffffffca8,0));
    if (*(int *)(in_RDI + 0x238) == 0) {
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x169c86);
      particleSamples::get_positive_particle
                (in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                 SUB84(in_stack_fffffffffffffca8,0));
      dVar5 = sqrt(local_110 * local_110 + -(local_1c0 * local_1c0));
      local_148 = log((dVar5 + local_98) / (dVar5 - local_98));
    }
    else {
      local_148 = log((local_110 + local_98) / (local_110 - local_98));
    }
    local_148 = local_148 * 0.5;
    if ((*(double *)(in_RDI + 0x240) <= local_148 && local_148 != *(double *)(in_RDI + 0x240)) &&
       (local_148 < *(double *)(in_RDI + 0x248))) {
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x169ddd);
      particleSamples::get_positive_particle
                (in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                 SUB84(in_stack_fffffffffffffca8,0));
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x169e1b);
      particleSamples::get_positive_particle
                (in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                 SUB84(in_stack_fffffffffffffca8,0));
      dVar5 = sqrt(local_238 * local_238 + local_2b0 * local_2b0);
      if ((*(double *)(in_RDI + 0x2b8) <= dVar5 && dVar5 != *(double *)(in_RDI + 0x2b8)) &&
         (dVar5 < *(double *)(in_RDI + 0x2c0))) {
        dVar6 = atan2(local_2b0,local_238);
        iVar2 = (int)((dVar5 - *(double *)(in_RDI + 0x1d8)) / *(double *)(in_RDI + 0x1e8));
        if ((-1 < iVar2) && (iVar2 < *(int *)(in_RDI + 0x1d0))) {
          for (local_2e8 = 0; local_2e8 < *(int *)(in_RDI + 0x1c8); local_2e8 = local_2e8 + 1) {
            ppVar7 = (particleSamples *)cos((double)local_2e8 * dVar6);
            dVar5 = sin((double)local_2e8 * dVar6);
            ppVar8 = ppVar7;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_RDX,(long)local_2e8);
            *pvVar3 = (double)ppVar8 + *pvVar3;
            in_stack_fffffffffffffca8 = dVar5;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)local_2e8)
            ;
            *pvVar3 = in_stack_fffffffffffffca8 + *pvVar3;
            in_stack_fffffffffffffcb0 = ppVar7;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_RCX,(long)local_2e8);
            *pvVar3 = (double)in_stack_fffffffffffffcb0 * (double)ppVar7 + *pvVar3;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R9,(long)local_2e8)
            ;
            *pvVar3 = dVar5 * dVar5 + *pvVar3;
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_stack_00000008,(long)local_2e8);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)iVar2);
            *pvVar3 = (double)ppVar7 + *pvVar3;
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_stack_00000018,(long)local_2e8);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)iVar2);
            *pvVar3 = dVar5 + *pvVar3;
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_stack_00000010,(long)local_2e8);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)iVar2);
            *pvVar3 = (double)ppVar7 * (double)ppVar7 + *pvVar3;
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_stack_00000020,(long)local_2e8);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)iVar2);
            *pvVar3 = dVar5 * dVar5 + *pvVar3;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_Qn_vector_positive_charge(
    int event_id, vector<double> &event_Qn_real,
    vector<double> &event_Qn_real_err, vector<double> &event_Qn_imag,
    vector<double> &event_Qn_imag_err,
    vector<vector<double>> &event_Qn_diff_real,
    vector<vector<double>> &event_Qn_diff_real_err,
    vector<vector<double>> &event_Qn_diff_imag,
    vector<vector<double>> &event_Qn_diff_imag_err) {
    // first clean the results arrays
    for (int i = 0; i < order_max; i++) {
        event_Qn_real[i] = 0.0;
        event_Qn_real_err[i] = 0.0;
        event_Qn_imag[i] = 0.0;
        event_Qn_imag_err[i] = 0.0;
        for (int j = 0; j < npT; j++) {
            event_Qn_diff_real[i][j] = 0.0;
            event_Qn_diff_real_err[i][j] = 0.0;
            event_Qn_diff_imag[i][j] = 0.0;
            event_Qn_diff_imag_err[i][j] = 0.0;
        }
    }

    int number_of_particles =
        (particle_list->get_number_of_positive_particles(event_id));
    for (int i = 0; i < number_of_particles; i++) {
        double pz_local = particle_list->get_positive_particle(event_id, i).pz;
        double E_local = particle_list->get_positive_particle(event_id, i).E;

        double rap_local;
        if (rap_type == 0) {
            double mass =
                (particle_list->get_positive_particle(event_id, i).mass);
            double pmag = sqrt(E_local * E_local - mass * mass);
            rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
        } else {
            rap_local = 0.5 * log((E_local + pz_local) / (E_local - pz_local));
        }

        if (rap_local > rap_min && rap_local < rap_max) {
            double px_local =
                (particle_list->get_positive_particle(event_id, i).px);
            double py_local =
                (particle_list->get_positive_particle(event_id, i).py);
            double p_perp = sqrt(px_local * px_local + py_local * py_local);
            if (p_perp > vn_rapidity_dis_pT_min
                && p_perp < vn_rapidity_dis_pT_max) {
                double p_phi = atan2(py_local, px_local);
                int p_idx = static_cast<int>((p_perp - pT_min) / dpT);
                if (p_idx < 0 || p_idx >= npT) continue;
                for (int iorder = 0; iorder < order_max; iorder++) {
                    double cos_nphi = cos(iorder * p_phi);
                    double sin_nphi = sin(iorder * p_phi);
                    event_Qn_real[iorder] += cos_nphi;
                    event_Qn_imag[iorder] += sin_nphi;
                    event_Qn_real_err[iorder] += cos_nphi * cos_nphi;
                    event_Qn_imag_err[iorder] += sin_nphi * sin_nphi;
                    event_Qn_diff_real[iorder][p_idx] += cos_nphi;
                    event_Qn_diff_imag[iorder][p_idx] += sin_nphi;
                    event_Qn_diff_real_err[iorder][p_idx] +=
                        cos_nphi * cos_nphi;
                    event_Qn_diff_imag_err[iorder][p_idx] +=
                        sin_nphi * sin_nphi;
                }
            }
        }
    }
}